

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O3

int __thiscall Quartet::am(Quartet *this)

{
  return (this->bra).left.ijk._M_elems[0] + (this->ket).right.ijk._M_elems[1] +
         (this->ket).right.ijk._M_elems[0] + (this->bra).right.ijk._M_elems[2] +
         (this->ket).left.ijk._M_elems[1] + (this->bra).right.ijk._M_elems[0] +
         (this->ket).left.ijk._M_elems[2] + (this->bra).right.ijk._M_elems[1] +
         (this->ket).left.ijk._M_elems[0] + (this->bra).left.ijk._M_elems[2] +
         (this->bra).left.ijk._M_elems[1] + (this->ket).right.ijk._M_elems[2];
}

Assistant:

int am(void) const { return ijk[0] + ijk[1] + ijk[2]; }